

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

bool Assimp::BaseImporter::SimpleExtensionCheck(string *pFile,char *ext0,char *ext1,char *ext2)

{
  long lVar1;
  char *s1;
  int iVar2;
  char *ext_real;
  size_type pos;
  char *ext2_local;
  char *ext1_local;
  char *ext0_local;
  string *pFile_local;
  
  lVar1 = std::__cxx11::string::find_last_of((char)pFile,0x2e);
  if (lVar1 == -1) {
    pFile_local._7_1_ = false;
  }
  else {
    s1 = (char *)std::__cxx11::string::operator[]((ulong)pFile);
    iVar2 = ASSIMP_stricmp(s1,ext0);
    if (iVar2 == 0) {
      pFile_local._7_1_ = true;
    }
    else {
      if ((ext1 != (char *)0x0) && (iVar2 = ASSIMP_stricmp(s1,ext1), iVar2 == 0)) {
        return true;
      }
      if ((ext2 != (char *)0x0) && (iVar2 = ASSIMP_stricmp(s1,ext2), iVar2 == 0)) {
        return true;
      }
      pFile_local._7_1_ = false;
    }
  }
  return pFile_local._7_1_;
}

Assistant:

bool BaseImporter::SimpleExtensionCheck (const std::string& pFile,
    const char* ext0,
    const char* ext1,
    const char* ext2)
{
    std::string::size_type pos = pFile.find_last_of('.');

    // no file extension - can't read
    if( pos == std::string::npos)
        return false;

    const char* ext_real = & pFile[ pos+1 ];
    if( !ASSIMP_stricmp(ext_real,ext0) )
        return true;

    // check for other, optional, file extensions
    if (ext1 && !ASSIMP_stricmp(ext_real,ext1))
        return true;

    if (ext2 && !ASSIMP_stricmp(ext_real,ext2))
        return true;

    return false;
}